

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O3

void minLiterals(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (isSat == 0) {
    groupSize = 4;
    iVar10 = 2;
    if (numOfVariables != 1) {
      iVar10 = numOfVariables;
    }
    uVar1 = iVar10 + 5;
    if (-1 < (int)(iVar10 + 2U)) {
      uVar1 = iVar10 + 2U;
    }
    uVar12 = uVar1 & 0xfffffffc;
    groups = (int)uVar1 >> 2;
    sVar13 = (long)(int)(uVar12 + 2) << 2;
    numOfVariables = uVar12 + 1;
    permute = (int *)malloc(sVar13);
    unpermute = (int *)malloc(sVar13);
    piVar9 = (int *)malloc(sVar13);
    auVar5 = _DAT_00104020;
    auVar4 = _DAT_00104010;
    idpermute = piVar9;
    if (-6 < iVar10) {
      lVar11 = 0;
      auVar14._4_4_ = 0;
      auVar14._0_4_ = uVar12;
      auVar14._8_4_ = uVar12;
      auVar14._12_4_ = 0;
      auVar14 = auVar14 ^ _DAT_00104020;
      do {
        iVar10 = (int)lVar11;
        auVar15._8_4_ = iVar10;
        auVar15._0_8_ = lVar11;
        auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar15 = (auVar15 | auVar4) ^ auVar5;
        if ((bool)(~(auVar14._4_4_ < auVar15._4_4_ ||
                    auVar15._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar15._0_4_) & 1)) {
          piVar9[lVar11 + 1] = iVar10 + 1;
        }
        if ((auVar15._12_4_ != auVar14._12_4_ || auVar15._8_4_ <= auVar14._8_4_) &&
            auVar15._12_4_ <= auVar14._12_4_) {
          piVar9[lVar11 + 2] = iVar10 + 2;
        }
        lVar11 = lVar11 + 2;
      } while ((ulong)uVar12 + 2 != lVar11);
    }
    heading(uVar12 + 1);
    initGlobalPermute();
    piVar9 = permute;
    if (0 < numOfVariables) {
      lVar11 = 1;
      do {
        piVar9[lVar11] = (int)lVar11;
        bVar2 = lVar11 < numOfVariables;
        lVar11 = lVar11 + 1;
      } while (bVar2);
    }
    if (1 < groups) {
      iVar10 = 0;
      do {
        mainUnsatGroup(iVar10,-1);
        iVar10 = iVar10 + 1;
      } while (iVar10 < groups + -1);
    }
    lastUnsatGroup(-1);
    setAnnealingPermute();
    if (1 < groups) {
      iVar10 = 0;
      do {
        mainUnsatGroup(iVar10,1);
        iVar10 = iVar10 + 1;
      } while (iVar10 < groups + -1);
    }
    lastUnsatGroup(1);
    return;
  }
  groupSize = 5;
  numOfVariables = ((numOfVariables + -1) / 5) * 5 + 5;
  groups = numOfVariables / 5;
  initModel(numOfVariables);
  iVar10 = numOfVariables;
  sVar13 = (long)numOfVariables * 4 + 4;
  idpermute = (int *)malloc(sVar13);
  permute = (int *)malloc(sVar13);
  unpermute = (int *)malloc(sVar13);
  permute1 = (int *)malloc(sVar13);
  unpermute1 = (int *)malloc(sVar13);
  heading(iVar10);
  piVar9 = idpermute;
  if (0 < numOfVariables) {
    lVar11 = 1;
    do {
      piVar9[lVar11] = (int)lVar11;
      bVar2 = lVar11 < numOfVariables;
      lVar11 = lVar11 + 1;
    } while (bVar2);
  }
  initGlobalPermute();
  piVar9 = permute;
  if (0 < numOfVariables) {
    lVar11 = 1;
    do {
      piVar9[lVar11] = (int)lVar11;
      bVar2 = lVar11 < numOfVariables;
      lVar11 = lVar11 + 1;
    } while (bVar2);
  }
  if (0 < groups) {
    iVar10 = 0;
    do {
      firstSatGroup(iVar10,-1);
      iVar10 = iVar10 + 1;
    } while (iVar10 < groups);
  }
  iVar10 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    setAnnealingPermute1(iVar10);
    secondSatGroup(iVar10,1);
    piVar8 = unpermute1;
    piVar7 = unpermute;
    piVar6 = permute;
    piVar9 = permute1;
    if (!bVar3) break;
    if (0 < numOfVariables) {
      lVar11 = 0;
      do {
        piVar9[lVar11 + 1] = piVar6[lVar11 + 1];
        piVar8[lVar11 + 1] = piVar7[lVar11 + 1];
        lVar11 = lVar11 + 1;
      } while (lVar11 < numOfVariables);
    }
    initChums();
    iVar10 = 1;
    bVar2 = false;
  } while (bVar3);
  if (*stringOptions != (char *)0x0) {
    printModel(*stringOptions);
    return;
  }
  return;
}

Assistant:

void minLiterals ()
{
    int g,l,v;

    if (isSat)
    {
        groupSize = 5;
        numOfVariables = ((numOfVariables-1)/groupSize + 1) * groupSize;
        groups = numOfVariables/groupSize;
        initModel(numOfVariables);
        idpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        permute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        unpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
         permute1 = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
         unpermute1 = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        heading(numOfVariables);
       for (v=1;v<=numOfVariables;v++)
           idpermute[v] = v;

        initGlobalPermute();
        setPlainPermute();
        for (g=0;g<groups;g++)
            firstSatGroup (g, -1);


        for (l=0;l<2;l++)
        {
            setAnnealingPermute1(l);
            secondSatGroup(l, 1);
            if (l==0)
            {
                for (v=1;v<=numOfVariables;v++)
                {
                    permute1[v] = permute[v];
                    unpermute1[v] = unpermute[v];
                }
				initChums();
            }
        }
        if (stringOptions[MODEL] != NULL)
            printModel (stringOptions[MODEL]);
    }
    else
    {
        groupSize = 4;
        if (numOfVariables == 1)
            numOfVariables = 2;
        groups = (numOfVariables+2)/groupSize;
        numOfVariables = groupSize*groups + 1;
        permute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        unpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        idpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        for (v=1;v<=numOfVariables;v++)
        {
            idpermute[v] = v;
        }
        heading(numOfVariables);


        initGlobalPermute();
        setPlainPermute();
        for (g=0;g<groups-1;g++)
            mainUnsatGroup (g,-1);
        lastUnsatGroup (-1);
        setAnnealingPermute();
        for (g=0;g<groups-1;g++)
            mainUnsatGroup (g,1);
        lastUnsatGroup (1);
    }
}